

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

SegmentAnd<capnp::word_*>
capnp::_::WireHelpers::setListPointer
          (SegmentBuilder *segment,CapTableBuilder *capTable,WirePointer *ref,ListReader value,
          BuilderArena *orphanArena,bool canonical)

{
  char *pcVar1;
  long lVar2;
  BuilderArena *pBVar3;
  word *pwVar4;
  int iVar5;
  ListElementCount LVar6;
  StructPointerCount SVar7;
  ElementSize EVar8;
  ListElementCount LVar9;
  ulong uVar10;
  SegmentBuilder *pSVar11;
  word *srcTarget;
  void *pvVar12;
  ElementCount index;
  WirePointer *pWVar13;
  word *pwVar14;
  word *pwVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  byte *__src;
  long lVar21;
  ushort uVar22;
  ulong uVar23;
  WirePointer *dst;
  ushort uVar24;
  uint uVar25;
  ulong uVar26;
  uint uVar27;
  word *result_1;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  byte *pbVar31;
  bool bVar32;
  SegmentAnd<capnp::word_*> SVar33;
  AllocateResult AVar34;
  SegmentBuilder *local_c8;
  StructReader element;
  
  AVar34.words = (word *)ref;
  AVar34.segment = segment;
  LVar6 = value.elementCount;
  SVar7 = value.structPointerCount;
  EVar8 = value.elementSize;
  uVar30 = (ulong)value.elementCount;
  uVar23 = value.step * uVar30;
  if (0x7ffffff80 < uVar23) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[51]>
              ((Fault *)&element,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
               ,0x71a,FAILED,(char *)0x0,"\"encountered impossibly long struct list ListReader\"",
               (char (*) [51])"encountered impossibly long struct list ListReader");
    kj::_::Debug::Fault::fatal((Fault *)&element);
  }
  uVar10 = uVar23 + 0x3f >> 6;
  if (value.elementSize == INLINE_COMPOSITE) {
    uVar16 = value.structDataSize >> 6;
    if (canonical) {
      index = 0;
      uVar23 = 0;
      uVar26 = 0;
      while( true ) {
        uVar24 = (ushort)uVar26;
        uVar17 = uVar26 & 0xffff;
        uVar29 = uVar23 & 0xffff;
        if (index == LVar6) break;
        ListReader::getStructElement(&element,&value,index);
        pvVar12 = (void *)((ulong)(element.dataSize >> 3) + (long)element.data);
        uVar27 = (element.dataSize >> 3) + 7;
        do {
          uVar25 = uVar27;
          if (pvVar12 <= element.data) break;
          pcVar1 = (char *)((long)pvVar12 - 1);
          pvVar12 = (void *)((long)pvVar12 - 1);
          uVar27 = uVar25 - 1;
        } while (*pcVar1 == '\0');
        uVar25 = uVar25 >> 3;
        uVar26 = (ulong)uVar25;
        if (uVar25 <= (uint)uVar17) {
          uVar26 = uVar17;
        }
        lVar28 = (ulong)element.pointerCount << 3;
        do {
          lVar18 = lVar28;
          pWVar13 = (WirePointer *)((long)&((element.pointers)->offsetAndKind).value + lVar18);
          if (pWVar13 <= element.pointers) break;
          lVar28 = lVar18 + -8;
        } while (pWVar13[-1].field_1.upper32Bits == 0 && pWVar13[-1].offsetAndKind.value == 0);
        uVar23 = lVar18 >> 3;
        if (lVar18 >> 3 <= (long)uVar29) {
          uVar23 = uVar29;
        }
        index = index + 1;
      }
      uVar30 = (uVar29 + uVar17) * uVar30;
      bVar32 = uVar10 <= uVar30;
      lVar28 = uVar30 - uVar10;
      uVar10 = uVar30;
      uVar22 = (ushort)uVar23;
      if (bVar32 && lVar28 != 0) {
        kj::_::Debug::Fault::Fault
                  ((Fault *)&element,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x757,FAILED,"newTotalSize <= totalSize","");
        kj::_::Debug::Fault::fatal((Fault *)&element);
      }
    }
    else {
      uVar24 = (ushort)uVar16;
      uVar22 = value.structPointerCount;
    }
    iVar5 = (int)uVar10;
    uVar27 = iVar5 + 1;
    if (orphanArena == (BuilderArena *)0x0) {
      if ((ref->field_1).upper32Bits != 0 || (ref->offsetAndKind).value != 0) {
        zeroObject(segment,capTable,ref);
      }
      pwVar14 = segment->pos;
      if (((long)((long)(segment->super_SegmentReader).ptr.ptr +
                 ((segment->super_SegmentReader).ptr.size_ * 8 - (long)pwVar14)) >> 3 <
           (long)(ulong)uVar27) || (segment->pos = pwVar14 + uVar27, pwVar14 == (word *)0x0)) {
        pBVar3 = (BuilderArena *)(segment->super_SegmentReader).arena;
        uVar27 = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::allocate(capnp::_::WirePointer*&,capnp::_::SegmentBuilder*&,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::WirePointer::Kind,capnp::_::BuilderArena*)::_lambda()_1_>
                           (iVar5 + 2,(anon_class_1_0_00000001 *)&element);
        AVar34 = BuilderArena::allocate(pBVar3,uVar27);
        (ref->offsetAndKind).value =
             (int)AVar34.words - *(int *)&((AVar34.segment)->super_SegmentReader).ptr.ptr &
             0xfffffff8U | 2;
        ref->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)
                       ((AVar34.segment)->super_SegmentReader).id.value;
        *(undefined4 *)&(AVar34.words)->content = 1;
        pwVar14 = AVar34.words + 1;
      }
      else {
        (ref->offsetAndKind).value =
             ((uint)((ulong)((long)pwVar14 - (long)ref) >> 1) & 0xfffffffc) - 3;
      }
      ref = (WirePointer *)AVar34.words;
      local_c8 = AVar34.segment;
      SVar33.value = pwVar14;
      SVar33.segment = local_c8;
    }
    else {
      SVar33 = (SegmentAnd<capnp::word_*>)BuilderArena::allocate(orphanArena,uVar27);
      (ref->offsetAndKind).value = 0xfffffffd;
    }
    pwVar15 = SVar33.value;
    (ref->field_1).upper32Bits = iVar5 * 8 + 7;
    *(ListElementCount *)&pwVar15->content = LVar6 * 4;
    *(ushort *)((long)&pwVar15->content + 4) = uVar24;
    *(ushort *)((long)&pwVar15->content + 6) = uVar22;
    pwVar14 = pwVar15 + 1;
    uVar30 = (ulong)uVar24;
    uVar23 = (ulong)uVar16 & 0xffff;
    pwVar15 = pwVar15 + uVar30 + 1;
    uVar10 = (ulong)(uint)((int)uVar23 * 8);
    pbVar31 = value.ptr + uVar10;
    lVar28 = uVar10 + (ulong)SVar7 * 8;
    lVar18 = -8 - (long)pbVar31;
    __src = value.ptr;
    for (LVar9 = 0; local_c8 = SVar33.segment, LVar9 != LVar6; LVar9 = LVar9 + 1) {
      if (uVar24 != 0) {
        memcpy(pwVar14,__src,uVar30 * 8);
      }
      lVar20 = lVar18;
      for (lVar19 = 0; (ulong)uVar22 * 8 != lVar19; lVar19 = lVar19 + 8) {
        lVar21 = (long)(*(int *)(pbVar31 + lVar19) >> 2);
        lVar2 = lVar19 + lVar21 * 8;
        if (value.segment == (SegmentReader *)0x0) {
          srcTarget = (word *)(pbVar31 + lVar2 + 8);
        }
        else {
          pwVar4 = ((value.segment)->ptr).ptr;
          srcTarget = pwVar4 + ((value.segment)->ptr).size_;
          if (((long)&pwVar4->content + lVar20 >> 3 <= lVar21) &&
             (lVar21 <= (long)&srcTarget->content + lVar20 >> 3)) {
            srcTarget = (word *)(pbVar31 + lVar2 + 8);
          }
        }
        copyPointer(local_c8,capTable,(WirePointer *)((long)&pwVar15->content + lVar19),
                    value.segment,value.capTable,(WirePointer *)(pbVar31 + lVar19),srcTarget,
                    value.nestingLimit,(BuilderArena *)0x0,canonical);
        lVar20 = lVar20 + -8;
      }
      pwVar14 = pwVar14 + (ulong)uVar24 + (ulong)uVar22;
      __src = __src + (ulong)SVar7 * 8 + uVar23 * 8;
      pwVar15 = pwVar15 + uVar22 + uVar30;
      pbVar31 = pbVar31 + lVar28;
      lVar18 = lVar18 - lVar28;
    }
  }
  else {
    pWVar13 = ref;
    if (orphanArena == (BuilderArena *)0x0) {
      if ((ref->field_1).upper32Bits != 0 || (ref->offsetAndKind).value != 0) {
        zeroObject(segment,capTable,ref);
      }
      pwVar14 = segment->pos;
      SVar33.value = pwVar14;
      SVar33.segment = segment;
      if (((long)((long)(segment->super_SegmentReader).ptr.ptr +
                 ((segment->super_SegmentReader).ptr.size_ * 8 - (long)pwVar14)) >> 3 < (long)uVar10
          ) || (segment->pos = pwVar14 + uVar10, pwVar14 == (word *)0x0)) {
        pBVar3 = (BuilderArena *)(segment->super_SegmentReader).arena;
        uVar16 = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::allocate(capnp::_::WirePointer*&,capnp::_::SegmentBuilder*&,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::WirePointer::Kind,capnp::_::BuilderArena*)::_lambda()_1_>
                           ((SegmentWordCount)uVar10 + 1,(anon_class_1_0_00000001 *)&element);
        AVar34 = BuilderArena::allocate(pBVar3,uVar16);
        pWVar13 = (WirePointer *)AVar34.words;
        pSVar11 = AVar34.segment;
        (ref->offsetAndKind).value =
             (int)AVar34.words - *(int *)&(pSVar11->super_SegmentReader).ptr.ptr & 0xfffffff8U | 2;
        ref->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)
                       (pSVar11->super_SegmentReader).id.value;
        (pWVar13->offsetAndKind).value = 1;
        SVar33.value = (word *)(pWVar13 + 1);
        SVar33.segment = pSVar11;
      }
      else {
        (ref->offsetAndKind).value =
             ((uint)((ulong)((long)pwVar14 - (long)ref) >> 1) & 0xfffffffc) - 3;
      }
    }
    else {
      SVar33 = (SegmentAnd<capnp::word_*>)
               BuilderArena::allocate(orphanArena,(SegmentWordCount)uVar10);
      (ref->offsetAndKind).value = 0xfffffffd;
    }
    dst = (WirePointer *)SVar33.value;
    if (EVar8 == POINTER) {
      (pWVar13->field_1).upper32Bits = LVar6 * 8 | 6;
      lVar28 = 8;
      for (lVar18 = -8; lVar18 + uVar30 * 8 != -8; lVar18 = lVar18 + -8) {
        lVar19 = (long)(*(int *)(value.ptr + lVar28 + -8) >> 2);
        lVar20 = lVar28 + lVar19 * 8;
        if (value.segment == (SegmentReader *)0x0) {
          pwVar14 = (word *)(value.ptr + lVar20);
        }
        else {
          pwVar15 = ((value.segment)->ptr).ptr;
          pwVar14 = pwVar15 + ((value.segment)->ptr).size_;
          if (((long)pwVar15 + (lVar18 - (long)value.ptr) >> 3 <= lVar19) &&
             (lVar19 <= (long)pwVar14 + (lVar18 - (long)value.ptr) >> 3)) {
            pwVar14 = (word *)(value.ptr + lVar20);
          }
        }
        copyPointer(SVar33.segment,capTable,dst,value.segment,value.capTable,
                    (WirePointer *)(value.ptr + lVar28 + -8),pwVar14,value.nestingLimit,
                    (BuilderArena *)0x0,canonical);
        dst = dst + 1;
        lVar28 = lVar28 + 8;
      }
    }
    else {
      (pWVar13->field_1).upper32Bits = LVar6 * 8 | (uint)EVar8;
      uVar30 = uVar23 >> 3;
      if (7 < uVar23) {
        memcpy(dst,value.ptr,uVar30);
        uVar23 = (ulong)value.step * (ulong)value.elementCount;
      }
      if ((uVar23 & 7) != 0) {
        *(byte *)((long)&(dst->offsetAndKind).value + uVar30) =
             ~(-1 << (sbyte)(uVar23 & 7)) & value.ptr[uVar30];
      }
    }
  }
  return SVar33;
}

Assistant:

static SegmentAnd<word*> setListPointer(
      SegmentBuilder* segment, CapTableBuilder* capTable, WirePointer* ref, ListReader value,
      BuilderArena* orphanArena = nullptr, bool canonical = false) {
    auto totalSize = assertMax<kj::maxValueForBits<SEGMENT_WORD_COUNT_BITS>() - 1>(
        roundBitsUpToWords(upgradeBound<uint64_t>(value.elementCount) * value.step),
        []() { KJ_FAIL_ASSERT("encountered impossibly long struct list ListReader"); });

    if (value.elementSize != ElementSize::INLINE_COMPOSITE) {
      // List of non-structs.
      word* ptr = allocate(ref, segment, capTable, totalSize, WirePointer::LIST, orphanArena);

      if (value.elementSize == ElementSize::POINTER) {
        // List of pointers.
        ref->listRef.set(ElementSize::POINTER, value.elementCount);
        for (auto i: kj::zeroTo(value.elementCount * (ONE * POINTERS / ELEMENTS))) {
          copyPointer(segment, capTable, reinterpret_cast<WirePointer*>(ptr) + i,
                      value.segment, value.capTable,
                      reinterpret_cast<const WirePointer*>(value.ptr) + i,
                      value.nestingLimit, nullptr, canonical);
        }
      } else {
        // List of data.
        ref->listRef.set(value.elementSize, value.elementCount);

        auto wholeByteSize =
          assertMax(MAX_SEGMENT_WORDS * BYTES_PER_WORD,
            upgradeBound<uint64_t>(value.elementCount) * value.step / BITS_PER_BYTE,
            []() { KJ_FAIL_ASSERT("encountered impossibly long data ListReader"); });
        copyMemory(reinterpret_cast<byte*>(ptr), value.ptr, wholeByteSize);
        auto leftoverBits =
          (upgradeBound<uint64_t>(value.elementCount) * value.step) % BITS_PER_BYTE;
        if (leftoverBits > ZERO * BITS) {
          // We need to copy a partial byte.
          uint8_t mask = (1 << unbound(leftoverBits / BITS)) - 1;
          *((reinterpret_cast<byte*>(ptr)) + wholeByteSize) = mask & *(value.ptr + wholeByteSize);
        }
      }

      return { segment, ptr };
    } else {
      // List of structs.
      StructDataWordCount declDataSize = value.structDataSize / BITS_PER_WORD;
      StructPointerCount declPointerCount = value.structPointerCount;

      StructDataWordCount dataSize = ZERO * WORDS;
      StructPointerCount ptrCount = ZERO * POINTERS;

      if (canonical) {
        for (auto i: kj::zeroTo(value.elementCount)) {
          auto element = value.getStructElement(i);

          // Truncate the data section
          auto data = element.getDataSectionAsBlob();
          auto end = data.end();
          while (end > data.begin() && end[-1] == 0) --end;
          dataSize = kj::max(dataSize, roundBytesUpToWords(
              intervalLength(data.begin(), end, MAX_STUCT_DATA_WORDS * BYTES_PER_WORD)));

          // Truncate pointer section
          const WirePointer* ptr = element.pointers + element.pointerCount;
          while (ptr > element.pointers && ptr[-1].isNull()) --ptr;
          ptrCount = kj::max(ptrCount,
              intervalLength(element.pointers, ptr, MAX_STRUCT_POINTER_COUNT));
        }
        auto newTotalSize = (dataSize + upgradeBound<uint64_t>(ptrCount) * WORDS_PER_POINTER)
            / ELEMENTS * value.elementCount;
        KJ_ASSERT(newTotalSize <= totalSize);  // we've only removed data!
        totalSize = assumeMax<kj::maxValueForBits<SEGMENT_WORD_COUNT_BITS>() - 1>(newTotalSize);
      } else {
        dataSize = declDataSize;
        ptrCount = declPointerCount;
      }

      KJ_DASSERT(value.structDataSize % BITS_PER_WORD == ZERO * BITS);
      word* ptr = allocate(ref, segment, capTable, totalSize + POINTER_SIZE_IN_WORDS,
                           WirePointer::LIST, orphanArena);
      ref->listRef.setInlineComposite(totalSize);

      WirePointer* tag = reinterpret_cast<WirePointer*>(ptr);
      tag->setKindAndInlineCompositeListElementCount(WirePointer::STRUCT, value.elementCount);
      tag->structRef.set(dataSize, ptrCount);
      word* dst = ptr + POINTER_SIZE_IN_WORDS;

      const word* src = reinterpret_cast<const word*>(value.ptr);
      for (auto i KJ_UNUSED: kj::zeroTo(value.elementCount)) {
        copyMemory(dst, src, dataSize);
        dst += dataSize;
        src += declDataSize;

        for (auto j: kj::zeroTo(ptrCount)) {
          copyPointer(segment, capTable, reinterpret_cast<WirePointer*>(dst) + j,
              value.segment, value.capTable, reinterpret_cast<const WirePointer*>(src) + j,
              value.nestingLimit, nullptr, canonical);
        }
        dst += ptrCount * WORDS_PER_POINTER;
        src += declPointerCount * WORDS_PER_POINTER;
      }

      return { segment, ptr };
    }
  }